

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buf_slot.cpp
# Opt level: O0

MPP_RET mpp_buf_slot_dequeue(MppBufSlots slots,RK_S32 *index,SlotQueueType type)

{
  list_head *entry;
  int iVar1;
  MppBufSlotEntry *slot;
  undefined1 local_40 [8];
  AutoMutex auto_lock;
  MppBufSlotsImpl *impl;
  SlotQueueType type_local;
  RK_S32 *index_local;
  MppBufSlots slots_local;
  
  if ((slots == (MppBufSlots)0x0) || (index == (RK_S32 *)0x0)) {
    _mpp_log_l(2,"mpp_buf_slot","found NULL input\n","mpp_buf_slot_dequeue");
    slots_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    auto_lock.mLock = (Mutex *)slots;
    Mutex::Autolock::Autolock((Autolock *)local_40,*slots,1);
    iVar1 = list_empty((list_head *)((long)&auto_lock.mLock[4].mMutex + (ulong)type * 0x10));
    if (iVar1 == 0) {
      entry = *(list_head **)((long)&auto_lock.mLock[4].mMutex + (ulong)type * 0x10);
      if ((*(uint *)&entry[1].next >> 1 & 1) == 0) {
        list_del_init(entry);
        if (auto_lock.mLock[2].mMutex.__data.__kind <= *(int *)((long)&entry[1].next + 4)) {
          _dump_slots("mpp_buf_slot_dequeue",(MppBufSlotsImpl *)auto_lock.mLock);
          _mpp_log_l(2,"mpp_buf_slot","Assertion %s failed at %s:%d\n",(char *)0x0,
                     "slot->index < impl->buf_count","mpp_buf_slot_dequeue",0x459);
          abort();
        }
        slot_ops_with_log((MppBufSlotsImpl *)auto_lock.mLock,(MppBufSlotEntry *)&entry[-1].prev,
                          type + 0x13,(void *)0x0);
        ((auto_lock.mLock)->mMutex).__data.__kind = ((auto_lock.mLock)->mMutex).__data.__kind + 1;
        *index = *(RK_S32 *)((long)&entry[1].next + 4);
        slots_local._4_4_ = MPP_OK;
      }
      else {
        slots_local._4_4_ = MPP_NOK;
      }
    }
    else {
      slots_local._4_4_ = MPP_NOK;
    }
    Mutex::Autolock::~Autolock((Autolock *)local_40);
  }
  return slots_local._4_4_;
}

Assistant:

MPP_RET mpp_buf_slot_dequeue(MppBufSlots slots, RK_S32 *index, SlotQueueType type)
{
    if (NULL == slots || NULL == index) {
        mpp_err_f("found NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    MppBufSlotsImpl *impl = (MppBufSlotsImpl *)slots;
    AutoMutex auto_lock(impl->lock);
    if (list_empty(&impl->queue[type]))
        return MPP_NOK;

    MppBufSlotEntry *slot = list_entry(impl->queue[type].next, MppBufSlotEntry, list);
    if (slot->status.not_ready)
        return MPP_NOK;

    // make sure that this slot is just the next display slot
    list_del_init(&slot->list);
    slot_assert(impl, slot->index < impl->buf_count);
    slot_ops_with_log(impl, slot, (MppBufSlotOps)(SLOT_DEQUEUE + type), NULL);
    impl->display_count++;
    *index = slot->index;

    return MPP_OK;
}